

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall
cmStateDirectory::AppendProperty
          (cmStateDirectory *this,string *prop,string *value,bool asString,cmListFileBacktrace *lfbt
          )

{
  bool bVar1;
  PointerType pBVar2;
  cmListFileBacktrace local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1f0;
  cmListFileBacktrace local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_190;
  cmListFileBacktrace local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_130;
  cmListFileBacktrace local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d0;
  cmListFileBacktrace local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *lfbt_local;
  string *psStack_20;
  bool asString_local;
  string *value_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  local_30 = lfbt;
  lfbt_local._7_1_ = asString;
  psStack_20 = value;
  value_local = prop;
  prop_local = (string *)this;
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_80,(string *)psStack_20);
    cmListFileBacktrace::cmListFileBacktrace(&local_90,local_30);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_60,&local_80,&local_90);
    AppendIncludeDirectoriesEntry(this,&local_60);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_60);
    cmListFileBacktrace::~cmListFileBacktrace(&local_90);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    bVar1 = std::operator==(value_local,"COMPILE_OPTIONS");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_f0,(string *)psStack_20);
      cmListFileBacktrace::cmListFileBacktrace(&local_100,local_30);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_d0,&local_f0,&local_100);
      AppendCompileOptionsEntry(this,&local_d0);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_d0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_100);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      bVar1 = std::operator==(value_local,"COMPILE_DEFINITIONS");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_150,(string *)psStack_20);
        cmListFileBacktrace::cmListFileBacktrace(&local_160,local_30);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_130,&local_150,&local_160);
        AppendCompileDefinitionsEntry(this,&local_130);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_130);
        cmListFileBacktrace::~cmListFileBacktrace(&local_160);
        std::__cxx11::string::~string((string *)&local_150);
      }
      else {
        bVar1 = std::operator==(value_local,"LINK_OPTIONS");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_1b0,(string *)psStack_20);
          cmListFileBacktrace::cmListFileBacktrace(&local_1c0,local_30);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_190,&local_1b0,&local_1c0);
          AppendLinkOptionsEntry(this,&local_190);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_190);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
          std::__cxx11::string::~string((string *)&local_1b0);
        }
        else {
          bVar1 = std::operator==(value_local,"LINK_DIRECTORIES");
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_210,(string *)psStack_20);
            cmListFileBacktrace::cmListFileBacktrace(&local_220,local_30);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      (&local_1f0,&local_210,&local_220);
            AppendLinkDirectoriesEntry(this,&local_1f0);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT(&local_1f0);
            cmListFileBacktrace::~cmListFileBacktrace(&local_220);
            std::__cxx11::string::~string((string *)&local_210);
          }
          else {
            pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::AppendProperty
                      (&pBVar2->Properties,value_local,psStack_20,(bool)(lfbt_local._7_1_ & 1));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmStateDirectory::AppendProperty(const std::string& prop,
                                      const std::string& value, bool asString,
                                      cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    this->AppendIncludeDirectoriesEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    this->AppendCompileOptionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    this->AppendCompileDefinitionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_OPTIONS") {
    this->AppendLinkOptionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    this->AppendLinkDirectoriesEntry(BT<std::string>(value, lfbt));
    return;
  }

  this->DirectoryState->Properties.AppendProperty(prop, value, asString);
}